

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void reboot_now(CHAR_DATA *ch)

{
  DESCRIPTOR_DATA *pDVar1;
  DESCRIPTOR_DATA *dclose;
  bool bVar2;
  CHAR_DATA *ch_00;
  
  do_force(ch,"all save");
  do_echo(ch,"*** REBOOTING NOW ***");
  dclose = descriptor_list;
  while (dclose != (DESCRIPTOR_DATA *)0x0) {
    ch_00 = dclose->original;
    if (ch_00 == (CHAR_DATA *)0x0) {
      ch_00 = dclose->character;
    }
    pDVar1 = dclose->next;
    if ((ch_00 != (CHAR_DATA *)0x0) && (dclose->connected == 0)) {
      bVar2 = is_affected(ch_00,(int)gsn_cloak_form);
      if (bVar2) {
        do_cloak(ch_00,"auto");
      }
      save_char_obj(ch_00);
    }
    close_socket(dclose);
    dclose = pDVar1;
  }
  merc_down = true;
  return;
}

Assistant:

void reboot_now(CHAR_DATA *ch)
{
	DESCRIPTOR_DATA *d, *d_next;
	CHAR_DATA *vch;

	/*
	OBJ_DATA *t_obj, *obj;
	for (obj = object_list; obj != nullptr; obj = obj->next)
	{
		if(obj->item_type != ITEM_CORPSE_PC || !obj->contains)
			continue;

		for(owner=char_list;owner!=nullptr;owner=owner->next)
		{
			if(!is_npc(owner) && !str_cmp(owner->true_name,obj->owner))
			{
				send_to_char("Your corpse decays.\n\r",owner);

				for (t_obj = obj->contains; t_obj != nullptr; t_obj = t_obj->next_content)
				{
					act_new("$p returns to you.",owner,t_obj,0,TO_CHAR,POS_DEAD);

					if(t_obj->item_type==ITEM_MONEY)
					{
						owner->gold += t_obj->value[1];
						extract_obj(t_obj);
						continue;
					}

					obj_from_obj(t_obj);
					obj_to_char(t_obj,owner);
				}

				extract_obj(obj);
				break;
			}
		}
	}
	*/

	do_force(ch, "all save");
	do_echo(ch, "*** REBOOTING NOW ***");

	for (d = descriptor_list; d != nullptr; d = d_next)
	{
		d_next = d->next;
		vch = d->original ? d->original : d->character;

		if (vch != nullptr && d->connected == 0)
		{
			if (is_affected(vch, gsn_cloak_form))
				do_cloak(vch, "auto");

			save_char_obj(vch);
		}

		close_socket(d);
	}

	merc_down = true;
}